

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctor.hpp
# Opt level: O2

void __thiscall
njoy::ENDFtk::record::InterpolationBase::
InterpolationBase<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
          (InterpolationBase *this,Base *metadata,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *it,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *end,long *lineNumber,int MAT,int MF,int MT)

{
  undefined4 in_register_0000008c;
  int in_stack_ffffffffffffffb8;
  
  readRangeDescriptions<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            ((tuple<std::vector<long,_std::allocator<long>_>,_std::vector<long,_std::allocator<long>_>_>
              *)&stack0xffffffffffffffb8,
             (InterpolationBase *)
             (metadata->fields).super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
             super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
             super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>
             .super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl,
             (long)it,end,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)lineNumber,(long *)CONCAT44(in_register_0000008c,MAT),MF,MT,
             in_stack_ffffffffffffffb8);
  InterpolationBase(this,metadata,
                    (tuple<std::vector<long,_std::allocator<long>_>,_std::vector<long,_std::allocator<long>_>_>
                     *)&stack0xffffffffffffffb8);
  std::
  _Tuple_impl<0UL,_std::vector<long,_std::allocator<long>_>,_std::vector<long,_std::allocator<long>_>_>
  ::~_Tuple_impl((_Tuple_impl<0UL,_std::vector<long,_std::allocator<long>_>,_std::vector<long,_std::allocator<long>_>_>
                  *)&stack0xffffffffffffffb8);
  return;
}

Assistant:

InterpolationBase
( Base&& metadata,
  Iterator& it, const Iterator& end, long& lineNumber, int MAT, int MF, int MT ) :
  InterpolationBase( std::move( metadata ),
                     readRangeDescriptions( std::get<4>( metadata.fields ),
                                              it, end, lineNumber,
                                              MAT, MF, MT ) ) {}